

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int rrc_a(em8051 *aCPU)

{
  uchar uVar1;
  int newc;
  int c;
  em8051 *aCPU_local;
  
  uVar1 = aCPU->mSFR[0x60];
  aCPU->mSFR[0x60] =
       (byte)((int)(uint)aCPU->mSFR[0x60] >> 1) | (byte)(((int)(aCPU->mSFR[0x50] & 0x80) >> 7) << 7)
  ;
  aCPU->mSFR[0x50] = aCPU->mSFR[0x50] & 0x7f | uVar1 << 7;
  aCPU->mPC = aCPU->mPC + 1;
  return 0;
}

Assistant:

static int rrc_a(struct em8051 *aCPU)
{
    int c = (PSW & PSWMASK_C) >> PSW_C;
    int newc = ACC & 1;
    ACC = (ACC >> 1) | (c << 7);
    PSW = (PSW & ~PSWMASK_C) | (newc << PSW_C);
    PC++;
    return 0;
}